

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal.hpp
# Opt level: O2

bool duckdb::TryCastDecimalCInternal<bool>(duckdb_result *source,idx_t col,idx_t row)

{
  bool bVar1;
  undefined8 in_RAX;
  bool result_value;
  bool local_1;
  
  local_1 = SUB81((ulong)in_RAX >> 0x38,0);
  bVar1 = CastDecimalCInternal<bool>(source,&local_1,col,row);
  if (!bVar1) {
    local_1 = false;
  }
  return local_1;
}

Assistant:

RESULT_TYPE TryCastDecimalCInternal(duckdb_result *source, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!CastDecimalCInternal<RESULT_TYPE>(source, result_value, col, row)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}